

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemCast(Mem *pMem,u8 aff,u8 encoding)

{
  int iVar1;
  u8 encoding_local;
  u8 aff_local;
  Mem *pMem_local;
  
  if ((pMem->flags & 1) == 0) {
    switch(aff) {
    case 'A':
      if ((pMem->flags & 0x10) == 0) {
        sqlite3ValueApplyAffinity(pMem,'B',encoding);
        if ((pMem->flags & 2) != 0) {
          pMem->flags = pMem->flags & 0xf240 | 0x10;
        }
      }
      else {
        pMem->flags = pMem->flags & 0xf250;
      }
      break;
    default:
      pMem->flags = pMem->flags | (ushort)((int)(pMem->flags & 0x10) >> 3);
      sqlite3ValueApplyAffinity(pMem,'B',encoding);
      pMem->flags = pMem->flags & 0xfbc3;
      iVar1 = sqlite3VdbeChangeEncoding(pMem,(uint)encoding);
      return iVar1;
    case 'C':
      sqlite3VdbeMemNumerify(pMem);
      break;
    case 'D':
      sqlite3VdbeMemIntegerify(pMem);
      break;
    case 'E':
      sqlite3VdbeMemRealify(pMem);
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCast(Mem *pMem, u8 aff, u8 encoding){
  if( pMem->flags & MEM_Null ) return SQLITE_OK;
  switch( aff ){
    case SQLITE_AFF_BLOB: {   /* Really a cast to BLOB */
      if( (pMem->flags & MEM_Blob)==0 ){
        sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
        assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
        if( pMem->flags & MEM_Str ) MemSetTypeFlag(pMem, MEM_Blob);
      }else{
        pMem->flags &= ~(MEM_TypeMask&~MEM_Blob);
      }
      break;
    }
    case SQLITE_AFF_NUMERIC: {
      sqlite3VdbeMemNumerify(pMem);
      break;
    }
    case SQLITE_AFF_INTEGER: {
      sqlite3VdbeMemIntegerify(pMem);
      break;
    }
    case SQLITE_AFF_REAL: {
      sqlite3VdbeMemRealify(pMem);
      break;
    }
    default: {
      assert( aff==SQLITE_AFF_TEXT );
      assert( MEM_Str==(MEM_Blob>>3) );
      pMem->flags |= (pMem->flags&MEM_Blob)>>3;
      sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
      assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
      pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal|MEM_Blob|MEM_Zero);
      return sqlite3VdbeChangeEncoding(pMem, encoding);
    }
  }
  return SQLITE_OK;
}